

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
::_is_negative_in_pair
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  Index columnIndex_00;
  uint uVar1;
  bool bVar2;
  ID_index IVar3;
  Column *pCVar4;
  
  pCVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
           ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                         *)&this[-1].deathComp_,columnIndex);
  columnIndex_00 = (pCVar4->super_Chain_column_option).pairedColumn_;
  if (columnIndex_00 == 0xffffffff) {
    bVar2 = false;
  }
  else {
    uVar1 = (pCVar4->super_Chain_column_option).pivot_;
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
            ::get_pivot((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                         *)&this[-1].deathComp_,columnIndex_00);
    bVar2 = IVar3 < uVar1;
  }
  return bVar2;
}

Assistant:

inline bool Chain_vine_swap<Master_matrix>::_is_negative_in_pair(Index columnIndex)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    return CP::is_negative_in_pair(_matrix()->get_pivot(columnIndex));
  } else {
    auto& col = _matrix()->get_column(columnIndex);
    if (!col.is_paired()) return false;
    return col.get_pivot() > _matrix()->get_pivot(col.get_paired_chain_index());
  }
}